

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

MinTypMaxExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::MinTypMaxExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression*&,slang::SourceRange>
          (BumpAllocator *this,Type *args,Expression *args_1,Expression *args_2,Expression *args_3,
          Expression **args_4,SourceRange *args_5)

{
  Expression *pEVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  MinTypMaxExpression *pMVar4;
  
  pMVar4 = (MinTypMaxExpression *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((MinTypMaxExpression *)this->endPtr < pMVar4 + 1) {
    pMVar4 = (MinTypMaxExpression *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pMVar4 + 1);
  }
  pEVar1 = *args_4;
  SVar2 = args_5->startLoc;
  SVar3 = args_5->endLoc;
  (pMVar4->super_Expression).kind = MinTypMax;
  (pMVar4->super_Expression).type.ptr = args;
  (pMVar4->super_Expression).constant = (ConstantValue *)0x0;
  (pMVar4->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pMVar4->super_Expression).sourceRange.startLoc = SVar2;
  (pMVar4->super_Expression).sourceRange.endLoc = SVar3;
  pMVar4->selected_ = pEVar1;
  pMVar4->min_ = args_1;
  pMVar4->typ_ = args_2;
  pMVar4->max_ = args_3;
  return pMVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }